

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

SchemaElement * __thiscall
duckdb_parquet::SchemaElement::operator=(SchemaElement *this,SchemaElement *other58)

{
  int32_t iVar1;
  type tVar2;
  int32_t iVar3;
  
  iVar1 = other58->type_length;
  this->type = other58->type;
  this->type_length = iVar1;
  this->repetition_type = other58->repetition_type;
  std::__cxx11::string::_M_assign((string *)&this->name);
  tVar2 = other58->converted_type;
  iVar1 = other58->scale;
  iVar3 = other58->precision;
  this->num_children = other58->num_children;
  this->converted_type = tVar2;
  this->scale = iVar1;
  this->precision = iVar3;
  this->field_id = other58->field_id;
  iVar1 = (other58->logicalType).DECIMAL.precision;
  (this->logicalType).DECIMAL.scale = (other58->logicalType).DECIMAL.scale;
  (this->logicalType).DECIMAL.precision = iVar1;
  (this->logicalType).TIME.isAdjustedToUTC = (other58->logicalType).TIME.isAdjustedToUTC;
  (this->logicalType).TIME.unit.__isset = (other58->logicalType).TIME.unit.__isset;
  (this->logicalType).TIMESTAMP.isAdjustedToUTC = (other58->logicalType).TIMESTAMP.isAdjustedToUTC;
  (this->logicalType).TIMESTAMP.unit.__isset = (other58->logicalType).TIMESTAMP.unit.__isset;
  (this->logicalType).INTEGER.bitWidth = (other58->logicalType).INTEGER.bitWidth;
  (this->logicalType).INTEGER.isSigned = (other58->logicalType).INTEGER.isSigned;
  (this->logicalType).__isset = (other58->logicalType).__isset;
  this->__isset = other58->__isset;
  return this;
}

Assistant:

SchemaElement& SchemaElement::operator=(const SchemaElement& other58) {
  type = other58.type;
  type_length = other58.type_length;
  repetition_type = other58.repetition_type;
  name = other58.name;
  num_children = other58.num_children;
  converted_type = other58.converted_type;
  scale = other58.scale;
  precision = other58.precision;
  field_id = other58.field_id;
  logicalType = other58.logicalType;
  __isset = other58.__isset;
  return *this;
}